

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O3

int hash_query(lua_State *L)

{
  StkId pTVar1;
  StkId pTVar2;
  Table *t;
  GCObject *pGVar3;
  int iVar4;
  Node *pNVar5;
  ulong n;
  char *pcVar6;
  
  iVar4 = lua_type(L,2);
  if (iVar4 == -1) {
    iVar4 = lua_type(L,1);
    if (iVar4 != 4) {
      luaL_argerror(L,1,"string expected");
    }
    pTVar1 = L->ci->func;
    if ((pTVar1[1].tt_ & 0xf) == 4) {
      pGVar3 = pTVar1[1].value_.gc;
      if ((pGVar3->tt & 0xf) == 4) {
        n = (ulong)*(uint *)&pGVar3->field_0xc;
        goto LAB_0013475d;
      }
      pcVar6 = "((((((L->ci->func + (1)))->value_).gc)->tt) & 0x0F) == 4";
    }
    else {
      pcVar6 = "((((((((L->ci->func + (1))))->tt_)) & 0x0F)) == (4))";
    }
    __assert_fail(pcVar6,
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x328,"int hash_query(lua_State *)");
  }
  pTVar1 = L->ci->func;
  luaL_checktype(L,2,5);
  pTVar2 = L->ci->func;
  if (pTVar2[2].tt_ == 0x8005) {
    t = (Table *)pTVar2[2].value_.gc;
    if (t->tt == '\x05') {
      pNVar5 = luaH_mainposition(t,pTVar1 + 1);
      n = (long)pNVar5 - (long)t->node >> 5;
LAB_0013475d:
      lua_pushinteger(L,n);
      return 1;
    }
    pcVar6 = "((((L->ci->func + (2)))->value_).gc)->tt == 5";
  }
  else {
    pcVar6 = "(((((L->ci->func + (2))))->tt_) == (((5) | (1 << 15))))";
  }
  __assert_fail(pcVar6,
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                ,0x32e,"int hash_query(lua_State *)");
}

Assistant:

static int hash_query (lua_State *L) {
  if (lua_isnone(L, 2)) {
    luaL_argcheck(L, lua_type(L, 1) == LUA_TSTRING, 1, "string expected");
    lua_pushinteger(L, tsvalue(obj_at(L, 1))->hash);
  }
  else {
    TValue *o = obj_at(L, 1);
    Table *t;
    luaL_checktype(L, 2, LUA_TTABLE);
    t = hvalue(obj_at(L, 2));
    lua_pushinteger(L, luaH_mainposition(t, o) - t->node);
  }
  return 1;
}